

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

locate_result * __thiscall
boost::runtime::cla::parser::locate_parameter
          (locate_result *__return_storage_ptr__,parser *this,trie_ptr *curr_trie,cstring *name,
          cstring *token)

{
  _Base_ptr p_Var1;
  element_type *peVar2;
  pointer prVar3;
  reference_wrapper<const_boost::runtime::parameter_cla_id> rVar4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  pointer psVar8;
  element_type *peVar9;
  undefined1 auVar10 [8];
  shared_count sVar11;
  locate_result *plVar12;
  pointer psVar13;
  pointer psVar14;
  pointer psVar15;
  pointer psVar16;
  pointer psVar17;
  parameter_trie *__tmp;
  _Rb_tree_node_base *p_Var18;
  pointer prVar19;
  iterator pvVar20;
  pointer psVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  pair<std::_Rb_tree_iterator<const_boost::runtime::parameter_cla_id_*>,_bool> pVar24;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  typo_candidate_names;
  trie_ptr typo_cand;
  trie_ptr next_typo_cand;
  set<const_boost::runtime::parameter_cla_id_*,_std::less<const_boost::runtime::parameter_cla_id_*>,_std::allocator<const_boost::runtime::parameter_cla_id_*>_>
  unique_typo_candidate;
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_1d8;
  value_type local_1b8;
  vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  local_1a8;
  cstring *local_190;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  local_188;
  ambiguous_param local_168;
  undefined1 local_118 [8];
  shared_count asStack_110 [9];
  shared_count local_c8;
  ulong uStack_c0;
  undefined8 local_b8;
  ulong *local_b0;
  ulong *local_a8;
  undefined8 local_a0;
  locate_result *local_90;
  iterator local_88;
  undefined **local_80;
  char *local_78;
  char *local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  sp_counted_base *local_48;
  pointer pbStack_40;
  pointer local_38;
  
  local_1d8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.px = (element_type *)0x0;
  local_1b8.pn.pi_ = (sp_counted_base *)0x0;
  pvVar20 = name->m_begin;
  local_88 = name->m_end;
  local_190 = token;
  local_90 = __return_storage_ptr__;
  if (pvVar20 != local_88) {
    do {
      psVar8 = local_1d8.
               super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar5 = local_1d8.
               super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar21 = local_1d8.
                super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = local_1d8.
               super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (curr_trie->px == (element_type *)0x0) {
        for (; psVar7 = psVar21, psVar14 = psVar21, psVar13 = psVar6, psVar15 = psVar6,
            psVar16 = local_1d8.
                      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
            local_1d8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_1a8.
                 super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
            local_1d8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1a8.
                 super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
            psVar17 = local_1a8.
                      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar5 != psVar8;
            psVar5 = psVar5 + 1) {
          local_168.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error._0_8_ = psVar5->px;
          local_168.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error.param_name.m_begin = (iterator)(psVar5->pn).pi_;
          if ((sp_counted_base *)
              local_168.
              super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
              .super_input_error.super_param_error.param_name.m_begin != (sp_counted_base *)0x0) {
            LOCK();
            ((sp_counted_base *)
            local_168.
            super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
            .super_input_error.super_param_error.param_name.m_begin)->use_count_ =
                 ((sp_counted_base *)
                 local_168.
                 super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                 .super_input_error.super_param_error.param_name.m_begin)->use_count_ + 1;
            UNLOCK();
          }
          local_1d8.
          super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
          ._M_impl.super__Vector_impl_data._M_start = psVar21;
          local_1d8.
          super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar6;
          if ((parameter_cla_id *)
              local_168.
              super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
              .super_input_error.super_param_error._0_8_ == (parameter_cla_id *)0x0)
          goto LAB_0018f0fe;
          rt_cla_detail::parameter_trie::get_subtrie
                    ((parameter_trie *)local_118,
                     (char)local_168.
                           super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                           .super_input_error.super_param_error._0_8_);
          if (local_118 != (undefined1  [8])0x0) {
            std::
            vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ::push_back(&local_1a8,(value_type *)local_118);
          }
          detail::shared_count::~shared_count(asStack_110);
          detail::shared_count::~shared_count
                    ((shared_count *)
                     &local_168.
                      super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                      .super_input_error.super_param_error.param_name);
          psVar21 = local_1d8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar6 = local_1d8.
                   super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; local_1d8.
               super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17,
            local_1a8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar16,
            local_1a8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = psVar15,
            local_1a8.
            super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ._M_impl.super__Vector_impl_data._M_start = psVar14, psVar6 != psVar7;
            psVar7 = psVar7 + 1) {
          detail::shared_count::~shared_count(&psVar7->pn);
          psVar14 = local_1a8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar13 = psVar21;
          psVar15 = local_1a8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar16 = local_1a8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          psVar17 = local_1d8.
                    super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
      }
      else {
        rt_cla_detail::parameter_trie::get_subtrie((parameter_trie *)local_118,(char)curr_trie->px);
        sVar11.pi_ = asStack_110[0].pi_;
        auVar10 = local_118;
        local_168.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error.param_name.m_begin = (iterator)local_1b8.pn.pi_;
        local_168.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error._0_8_ = local_1b8.px;
        local_118 = (undefined1  [8])0x0;
        asStack_110[0].pi_ = (sp_counted_base *)0x0;
        local_1b8.px = (element_type *)auVar10;
        local_1b8.pn.pi_ = sVar11.pi_;
        detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_168.
                    super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                    .super_input_error.super_param_error.param_name);
        detail::shared_count::~shared_count(asStack_110);
        if ((parameter_cla_id *)local_1b8.px == (parameter_cla_id *)0x0) {
          peVar2 = curr_trie->px;
          if (peVar2 == (element_type *)0x0) goto LAB_0018f0fe;
          for (p_Var18 = (peVar2->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var18 != &(peVar2->m_subtrie)._M_t._M_impl.super__Rb_tree_header;
              p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
            std::
            vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
            ::push_back(&local_1d8,(value_type *)&p_Var18[1]._M_parent);
            p_Var1 = p_Var18[1]._M_parent;
            if (p_Var1 == (_Base_ptr)0x0) goto LAB_0018f0fe;
            rt_cla_detail::parameter_trie::get_subtrie((parameter_trie *)local_118,(char)p_Var1);
            sVar11.pi_ = asStack_110[0].pi_;
            auVar10 = local_118;
            local_168.
            super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
            .super_input_error.super_param_error.param_name.m_begin = (iterator)local_1b8.pn.pi_;
            local_168.
            super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
            .super_input_error.super_param_error._0_8_ = local_1b8.px;
            local_118 = (undefined1  [8])0x0;
            asStack_110[0].pi_ = (sp_counted_base *)0x0;
            local_1b8.px = (element_type *)auVar10;
            local_1b8.pn.pi_ = sVar11.pi_;
            detail::shared_count::~shared_count
                      ((shared_count *)
                       &local_168.
                        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                        .super_input_error.super_param_error.param_name);
            peVar9 = local_1b8.px;
            detail::shared_count::~shared_count(asStack_110);
            if ((parameter_cla_id *)peVar9 != (parameter_cla_id *)0x0) {
              std::
              vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
              ::push_back(&local_1d8,&local_1b8);
            }
            if (curr_trie->px == (element_type *)0x0) goto LAB_0018f0fe;
          }
          std::
          vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
          ::push_back(&local_1d8,curr_trie);
          local_168.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error._0_4_ = *(undefined4 *)&curr_trie->px;
          local_168.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error._4_4_ = *(undefined4 *)((long)&curr_trie->px + 4);
          uVar22 = *(undefined4 *)&(curr_trie->pn).pi_;
          uVar23 = *(undefined4 *)((long)&(curr_trie->pn).pi_ + 4);
          curr_trie->px = (element_type *)0x0;
          (curr_trie->pn).pi_ = (sp_counted_base *)0x0;
        }
        else {
          if (local_1b8.pn.pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (local_1b8.pn.pi_)->use_count_ = (local_1b8.pn.pi_)->use_count_ + 1;
            UNLOCK();
          }
          local_168.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error._0_4_ = *(undefined4 *)&curr_trie->px;
          local_168.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error._4_4_ = *(undefined4 *)((long)&curr_trie->px + 4);
          uVar22 = *(undefined4 *)&(curr_trie->pn).pi_;
          uVar23 = *(undefined4 *)((long)&(curr_trie->pn).pi_ + 4);
          curr_trie->px = local_1b8.px;
          (curr_trie->pn).pi_ = local_1b8.pn.pi_;
        }
        local_168.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error.param_name.m_begin = (iterator)CONCAT44(uVar23,uVar22);
        detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_168.
                    super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                    .super_input_error.super_param_error.param_name);
        psVar13 = local_1a8.
                  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_1a8.
      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar13;
      pvVar20 = pvVar20 + 1;
    } while (pvVar20 != local_88);
  }
  plVar12 = local_90;
  peVar2 = curr_trie->px;
  if (peVar2 != (element_type *)0x0) {
    prVar19 = (peVar2->m_id_candidates).
              super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    prVar3 = (peVar2->m_id_candidates).
             super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)prVar3 - (long)prVar19) < 9) {
      std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>::
      pair<boost::shared_ptr<boost::runtime::basic_param>_&,_true>
                (local_90,prVar3[-1].t_,&peVar2->m_param_candidate);
      detail::shared_count::~shared_count(&local_1b8.pn);
      std::
      vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ::~vector(&local_1a8);
      std::
      vector<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ::~vector(&local_1d8);
      return plVar12;
    }
    local_c8.pi_ = (sp_counted_base *)0x0;
    uStack_c0 = 0;
    local_b8 = 0;
    if (prVar19 != prVar3) {
      do {
        local_168.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error._0_8_ = (prVar19->t_->m_tag)._M_dataplus._M_p;
        local_168.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error.param_name.m_begin =
             (iterator)
             ((long)&(((trie_per_char *)
                      &((parameter_cla_id *)
                       local_168.
                       super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                       .super_input_error.super_param_error._0_8_)->m_prefix)->_M_t)._M_impl.
                     field_0x0 + (prVar19->t_->m_tag)._M_string_length);
        std::
        vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
        ::emplace_back<boost::unit_test::basic_cstring<char_const>>
                  ((vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
                    *)&local_c8,(basic_cstring<const_char> *)&local_168);
        if (curr_trie->px == (element_type *)0x0) {
LAB_0018f0fe:
          __assert_fail("px != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                        ,0x2de,
                        "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator->() const [T = boost::runtime::cla::rt_cla_detail::parameter_trie]"
                       );
        }
        prVar19 = prVar19 + 1;
      } while (prVar19 != prVar3);
    }
    local_68._M_p = (pointer)&local_58;
    local_78 = "";
    local_70 = "";
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    local_80 = &PTR__ambiguous_param_001caeb0;
    local_48 = local_c8.pi_;
    pbStack_40 = (pointer)uStack_c0;
    local_38 = (pointer)local_b8;
    local_c8.pi_ = (sp_counted_base *)0x0;
    uStack_c0 = 0;
    local_b8 = 0;
    specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>::operator<<
              ((ambiguous_param *)local_118,
               (specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error> *
               )&local_80,"An ambiguous parameter name in the argument ");
    specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error>::operator<<
              (&local_168,
               (specific_param_error<boost::runtime::ambiguous_param,boost::runtime::input_error> *)
               local_118,local_190);
    unit_test::ut_detail::throw_exception<boost::runtime::ambiguous_param>(&local_168);
  }
  local_188.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = &uStack_c0;
  uStack_c0 = uStack_c0 & 0xffffffff00000000;
  local_b8 = 0;
  local_a0 = 0;
  local_a8 = local_b0;
  std::
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ::reserve(&local_188,
            (long)local_1d8.
                  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1d8.
                  super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar5 = local_1d8.
           super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1d8.
      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1d8.
      super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar21 = local_1d8.
              super__Vector_base<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::allocator<boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_168.
      super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
      super_input_error.super_param_error._0_8_ = psVar21->px;
      local_168.
      super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
      super_input_error.super_param_error.param_name.m_begin = (iterator)(psVar21->pn).pi_;
      if ((sp_counted_base *)
          local_168.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error.param_name.m_begin != (sp_counted_base *)0x0) {
        LOCK();
        ((sp_counted_base *)
        local_168.
        super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
        super_input_error.super_param_error.param_name.m_begin)->use_count_ =
             ((sp_counted_base *)
             local_168.
             super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
             .super_input_error.super_param_error.param_name.m_begin)->use_count_ + 1;
        UNLOCK();
      }
      if ((parameter_cla_id *)
          local_168.
          super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>.
          super_input_error.super_param_error._0_8_ == (parameter_cla_id *)0x0) goto LAB_0018f0fe;
      prVar19 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)&((parameter_cla_id *)
                                     local_168.
                                     super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                                     .super_input_error.super_param_error._0_8_)->m_tag + 0x10))->
                         _M_allocated_capacity;
      prVar3 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((long)&((parameter_cla_id *)
                                    local_168.
                                    super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                                    .super_input_error.super_param_error._0_8_)->m_tag + 0x18))->
                        _M_allocated_capacity;
      if ((ulong)((long)prVar3 - (long)prVar19) < 9 && prVar3 != prVar19) {
        do {
          rVar4.t_ = prVar19->t_;
          local_118 = (undefined1  [8])rVar4.t_;
          pVar24 = std::
                   _Rb_tree<boost::runtime::parameter_cla_id_const*,boost::runtime::parameter_cla_id_const*,std::_Identity<boost::runtime::parameter_cla_id_const*>,std::less<boost::runtime::parameter_cla_id_const*>,std::allocator<boost::runtime::parameter_cla_id_const*>>
                   ::_M_insert_unique<boost::runtime::parameter_cla_id_const*>
                             ((_Rb_tree<boost::runtime::parameter_cla_id_const*,boost::runtime::parameter_cla_id_const*,std::_Identity<boost::runtime::parameter_cla_id_const*>,std::less<boost::runtime::parameter_cla_id_const*>,std::allocator<boost::runtime::parameter_cla_id_const*>>
                               *)&local_c8,(parameter_cla_id **)local_118);
          if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_118 = *(undefined1 (*) [8])&((rVar4.t_)->m_tag)._M_dataplus;
            asStack_110[0].pi_ =
                 (sp_counted_base *)
                 ((long)&(((parameter_cla_id *)local_118)->m_prefix)._M_dataplus._M_p +
                 *(size_type *)&((string *)((long)&(rVar4.t_)->m_tag + 8))->_M_dataplus);
            std::
            vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
            ::emplace_back<boost::unit_test::basic_cstring<char_const>>
                      ((vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>
                        *)&local_188,(basic_cstring<const_char> *)local_118);
          }
          if ((parameter_cla_id *)
              local_168.
              super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
              .super_input_error.super_param_error._0_8_ == (parameter_cla_id *)0x0)
          goto LAB_0018f0fe;
          prVar19 = prVar19 + 1;
        } while (prVar19 != prVar3);
      }
      detail::shared_count::~shared_count
                ((shared_count *)
                 &local_168.
                  super_specific_param_error<boost::runtime::ambiguous_param,_boost::runtime::input_error>
                  .super_input_error.super_param_error.param_name);
      psVar21 = psVar21 + 1;
    } while (psVar21 != psVar5);
  }
  local_68._M_p = (pointer)&local_58;
  local_78 = "";
  local_70 = "";
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_80 = &PTR__unrecognized_param_001cae88;
  local_48 = (sp_counted_base *)
             local_188.
             super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbStack_40 = local_188.
               super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = local_188.
             super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_188.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>::operator<<
            ((unrecognized_param *)local_118,
             (specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
              *)&local_80,"An unrecognized parameter in the argument ");
  specific_param_error<boost::runtime::unrecognized_param,boost::runtime::input_error>::operator<<
            ((unrecognized_param *)&local_168,
             (specific_param_error<boost::runtime::unrecognized_param,boost::runtime::input_error> *
             )local_118,local_190);
  unit_test::ut_detail::throw_exception<boost::runtime::unrecognized_param>
            ((unrecognized_param *)&local_168);
}

Assistant:

locate_result
    locate_parameter( trie_ptr curr_trie, cstring name, cstring token )
    {
        std::vector<trie_ptr> typo_candidates;
        std::vector<trie_ptr> next_typo_candidates;
        trie_ptr next_trie;

        BOOST_TEST_FOREACH( char, c, name ) {
            if( curr_trie ) {
                // locate next subtrie corresponding to the char
                next_trie = curr_trie->get_subtrie( c );

                if( next_trie )
                    curr_trie = next_trie;
                else {
                    // Initiate search for typo candicates. We will account for 'wrong char' typo
                    // 'missing char' typo and 'extra char' typo
                    BOOST_TEST_FOREACH( trie_per_char::value_type const&, typo_cand, curr_trie->m_subtrie ) {
                        // 'wrong char' typo
                        typo_candidates.push_back( typo_cand.second );

                        // 'missing char' typo
                        if( (next_trie = typo_cand.second->get_subtrie( c )) )
                            typo_candidates.push_back( next_trie );
                    }

                    // 'extra char' typo
                    typo_candidates.push_back( curr_trie );

                    curr_trie.reset();
                }
            }
            else {
                // go over existing typo candidates and see if they are still viable
                BOOST_TEST_FOREACH( trie_ptr, typo_cand, typo_candidates ) {
                    trie_ptr next_typo_cand = typo_cand->get_subtrie( c );

                    if( next_typo_cand )
                        next_typo_candidates.push_back( next_typo_cand );
                }

                next_typo_candidates.swap( typo_candidates );
                next_typo_candidates.clear();
            }
        }

        if( !curr_trie ) {
            std::vector<cstring> typo_candidate_names;
            std::set<parameter_cla_id const*> unique_typo_candidate; // !! ?? unordered_set
            typo_candidate_names.reserve( typo_candidates.size() );
// !! ??            unique_typo_candidate.reserve( typo_candidates.size() );

            BOOST_TEST_FOREACH( trie_ptr, trie_cand, typo_candidates ) {
                // avoid ambiguos candidate trie
                if( trie_cand->m_id_candidates.size() > 1 )
                    continue;

                BOOST_TEST_FOREACH( parameter_cla_id const&, param_cand, trie_cand->m_id_candidates ) {
                    if( !unique_typo_candidate.insert( &param_cand ).second )
                        continue;

                    typo_candidate_names.push_back( param_cand.m_tag );
                }
            }

#ifndef BOOST_NO_CXX11_RVALUE_REFERENCES
            BOOST_TEST_I_THROW( unrecognized_param( std::move(typo_candidate_names) )
                                << "An unrecognized parameter in the argument "
                                << token );
#else
            BOOST_TEST_I_THROW( unrecognized_param( typo_candidate_names )
                                << "An unrecognized parameter in the argument "
                                << token );
#endif
        }

        if( curr_trie->m_id_candidates.size() > 1 ) {
            std::vector<cstring> amb_names;
            BOOST_TEST_FOREACH( parameter_cla_id const&, param_id, curr_trie->m_id_candidates )
                amb_names.push_back( param_id.m_tag );

#ifndef BOOST_NO_CXX11_RVALUE_REFERENCES
            BOOST_TEST_I_THROW( ambiguous_param( std::move( amb_names ) )
                                << "An ambiguous parameter name in the argument " << token );
#else
            BOOST_TEST_I_THROW( ambiguous_param( amb_names )
                                << "An ambiguous parameter name in the argument " << token );
#endif
        }

        return locate_result( curr_trie->m_id_candidates.back().get(), curr_trie->m_param_candidate );
    }